

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

RepeatedField<long> * __thiscall
google::protobuf::Reflection::GetRawSplit<google::protobuf::RepeatedField<long>>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t offset;
  LogMessage *pLVar2;
  DescriptorStringView psVar3;
  void *message_00;
  RepeatedField<long> **ppRVar4;
  uint32_t field_offset;
  void *split;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  LogMessageFatal local_40 [23];
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
  if (!bVar1) {
    message_00 = GetSplitField(this,(Message *)field_local);
    offset = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,local_28);
    bVar1 = internal::SplitFieldHasExtraIndirectionStatic<google::protobuf::RepeatedField<long>>
                      (local_28);
    if (bVar1) {
      ppRVar4 = internal::GetConstPointerAtOffset<google::protobuf::RepeatedField<long>*>
                          (message_00,offset);
      this_local = (Reflection *)*ppRVar4;
    }
    else {
      this_local = (Reflection *)
                   internal::GetConstPointerAtOffset<google::protobuf::RepeatedField<long>>
                             (message_00,offset);
    }
    return (RepeatedField<long> *)this_local;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"!schema_.InRealOneof(field)");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message.h"
             ,0x642,local_50._M_len,local_50._M_str);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(char (*) [9])"Field = ")
  ;
  psVar3 = FieldDescriptor::full_name_abi_cxx11_(local_28);
  pLVar2 = (LogMessage *)
           absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(string *)psVar3);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
}

Assistant:

const Type& Reflection::GetRawSplit(const Message& message,
                                    const FieldDescriptor* field) const {
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const void* split = GetSplitField(&message);
  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  if (internal::SplitFieldHasExtraIndirectionStatic<Type>(field)) {
    return **internal::GetConstPointerAtOffset<Type*>(split, field_offset);
  }
  return *internal::GetConstPointerAtOffset<Type>(split, field_offset);
}